

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorsForTest * Catch::createGeneratorsForTest(void)

{
  IGeneratorsForTest *__s;
  GeneratorsForTest *unaff_retaddr;
  
  __s = (IGeneratorsForTest *)operator_new(0x50);
  memset(__s,0,0x50);
  GeneratorsForTest::GeneratorsForTest(unaff_retaddr);
  return __s;
}

Assistant:

IGeneratorsForTest* createGeneratorsForTest()
    {
        return new GeneratorsForTest();
    }